

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,StringTree *params_3,
          StringTree *params_4)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  StringTree *pSVar3;
  char *pos;
  ArrayPtr<const_char> *rest;
  StringTree *rest_2;
  StringTree *rest_3;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  _ *local_100;
  undefined8 local_f8;
  Array<kj::StringTree::Branch> local_f0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  _ *local_a0;
  undefined8 local_98;
  String local_90;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  _ *local_50;
  undefined8 local_48;
  undefined1 local_39;
  StringTree *local_38;
  StringTree *params_local_4;
  StringTree *params_local_3;
  StringTree *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_39 = 0;
  local_38 = params_3;
  params_local_4 = params_2;
  params_local_3 = (StringTree *)params_1;
  params_local_2 = (StringTree *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_78 = ArrayPtr<const_char>::size(params_local_1);
  local_70 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_2);
  local_68 = size(params_local_3);
  local_60 = size(params_local_4);
  local_58 = size(local_38);
  local_50 = (_ *)&local_78;
  local_48 = 5;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x5;
  sVar1 = _::sum(local_50,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>(params_local_3);
  local_b8 = flatSize(pSVar3);
  pSVar3 = fwd<kj::StringTree>(params_local_4);
  local_b0 = flatSize(pSVar3);
  pSVar3 = fwd<kj::StringTree>(local_38);
  local_a8 = flatSize(pSVar3);
  local_a0 = (_ *)&local_c8;
  local_98 = 5;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x5;
  sVar1 = _::sum(local_a0,nums_00);
  heapString(&local_90,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_90);
  String::~String(&local_90);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_128 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  local_120 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>(params_local_3);
  local_118 = branchCount(pSVar3);
  pSVar3 = fwd<kj::StringTree>(params_local_4);
  local_110 = branchCount(pSVar3);
  pSVar3 = fwd<kj::StringTree>(local_38);
  local_108 = branchCount(pSVar3);
  local_100 = (_ *)&local_128;
  local_f8 = 5;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x5;
  sVar1 = _::sum(local_100,nums_01);
  heapArray<kj::StringTree::Branch>(&local_f0,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_f0);
  Array<kj::StringTree::Branch>::~Array(&local_f0);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  pSVar3 = fwd<kj::StringTree>(params_local_3);
  rest_2 = fwd<kj::StringTree>(params_local_4);
  rest_3 = fwd<kj::StringTree>(local_38);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree>
            (__return_storage_ptr__,pos,0,pAVar2,rest,pSVar3,rest_2,rest_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}